

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.cpp
# Opt level: O3

void f_luaopen(lua_State *L,void *ud)

{
  global_State *pgVar1;
  GCObject *t;
  TString *pTVar2;
  TValue *io;
  Value local_38;
  undefined4 local_30;
  
  pgVar1 = L->l_G;
  stack_init(L,L);
  t = (GCObject *)luaH_new(L);
  (pgVar1->l_registry).value_.gc = t;
  (pgVar1->l_registry).tt_ = 0x45;
  luaH_resize(L,&t->h,2,0);
  local_30 = 0x48;
  local_38 = (Value)L;
  luaH_setint(L,&t->h,1,(TValue *)&local_38);
  local_38.gc = (GCObject *)luaH_new(L);
  local_30 = 0x45;
  luaH_setint(L,&t->h,2,(TValue *)&local_38);
  luaS_resize(L,0x20);
  luaT_init(L);
  luaX_init(L);
  pTVar2 = luaS_newlstr(L,"not enough memory",0x11);
  pgVar1->memerrmsg = pTVar2;
  (pTVar2->tsv).marked = (pTVar2->tsv).marked | 0x20;
  pgVar1->gcrunning = '\x01';
  return;
}

Assistant:

static void f_luaopen (lua_State *L, void *ud) {
  global_State *g = G(L);
  UNUSED(ud);
  stack_init(L, L);  /* init stack */
  init_registry(L, g);
  luaS_resize(L, MINSTRTABSIZE);  /* initial size of string table */
  luaT_init(L);
  luaX_init(L);
  /* pre-create memory-error message */
  g->memerrmsg = luaS_newliteral(L, MEMERRMSG);
  luaS_fix(g->memerrmsg);  /* it should never be collected */
  g->gcrunning = 1;  /* allow gc */
}